

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_SetGlobalVar(JSContext *ctx,JSAtom prop,JSValue val,int flag)

{
  void *pvVar1;
  JSShape *sh_00;
  JSValue new_val;
  uint uVar2;
  int iVar3;
  uint32_t *puVar4;
  JSShapeProperty *pJVar5;
  JSContext *in_RCX;
  JSValue *pJVar6;
  undefined8 in_RDX;
  uint in_ESI;
  JSContext *in_RDI;
  int in_R8D;
  int flags;
  JSProperty *pr;
  JSShapeProperty *prs;
  JSObject *p;
  intptr_t h;
  JSShapeProperty *prop_1;
  JSShapeProperty *pr_1;
  JSShape *sh;
  JSAtom in_stack_00000104;
  JSContext *in_stack_00000108;
  undefined1 in_stack_00000110 [16];
  undefined1 in_stack_00000120 [16];
  int in_stack_000001e0;
  JSAtom in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  JSValueUnion ctx_00;
  JSValue in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  JSAtom name;
  ulong local_40;
  JSShapeProperty *local_8;
  
  name = (JSAtom)((ulong)in_RDX >> 0x20);
  pvVar1 = (in_RDI->global_var_obj).u.ptr;
  sh_00 = *(JSShape **)((long)pvVar1 + 0x18);
  uVar2 = sh_00->prop_hash_mask;
  puVar4 = prop_hash_end(sh_00);
  uVar2 = puVar4[-1 - (ulong)(in_ESI & uVar2)];
  pJVar5 = get_shape_prop(sh_00);
  do {
    local_40 = (ulong)uVar2;
    if (local_40 == 0) {
      pJVar6 = (JSValue *)0x0;
      local_8 = (JSShapeProperty *)0x0;
LAB_0015d37c:
      if (local_8 == (JSShapeProperty *)0x0) {
        is_strict_mode(in_RDI);
        iVar3 = JS_SetPropertyInternal
                          (in_stack_00000108,(JSValue)in_stack_00000120,in_stack_00000104,
                           (JSValue)in_stack_00000110,in_stack_000001e0);
        return iVar3;
      }
      if (in_R8D != 1) {
        iVar3 = JS_IsUninitialized(*pJVar6);
        ctx_00 = in_stack_ffffffffffffff68.u;
        if (iVar3 != 0) {
          JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff68);
          JS_ThrowReferenceErrorUninitialized(in_RCX,name);
          return -1;
        }
        if ((*(uint *)local_8 >> 0x1a & 2) == 0) {
          JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff68);
          iVar3 = JS_ThrowTypeErrorReadOnly
                            ((JSContext *)ctx_00.ptr,in_stack_ffffffffffffff64,
                             in_stack_ffffffffffffff60);
          return iVar3;
        }
      }
      new_val.u._4_4_ = in_stack_ffffffffffffff7c;
      new_val.u.int32 = in_stack_ffffffffffffff78;
      new_val.tag = (int64_t)pJVar6;
      set_value((JSContext *)in_stack_ffffffffffffff68.tag,
                (JSValue *)in_stack_ffffffffffffff68.u.ptr,new_val);
      return 0;
    }
    local_8 = pJVar5 + (local_40 - 1);
    if (local_8->atom == in_ESI) {
      pJVar6 = (JSValue *)(*(long *)((long)pvVar1 + 0x20) + (local_40 - 1) * 0x10);
      goto LAB_0015d37c;
    }
    uVar2 = *(uint *)local_8 & 0x3ffffff;
  } while( true );
}

Assistant:

static int JS_SetGlobalVar(JSContext *ctx, JSAtom prop, JSValue val,
                           int flag)
{
    JSObject *p;
    JSShapeProperty *prs;
    JSProperty *pr;
    int flags;

    /* no exotic behavior is possible in global_var_obj */
    p = JS_VALUE_GET_OBJ(ctx->global_var_obj);
    prs = find_own_property(&pr, p, prop);
    if (prs) {
        /* XXX: should handle JS_PROP_AUTOINIT properties? */
        if (flag != 1) {
            if (unlikely(JS_IsUninitialized(pr->u.value))) {
                JS_FreeValue(ctx, val);
                JS_ThrowReferenceErrorUninitialized(ctx, prs->atom);
                return -1;
            }
            if (unlikely(!(prs->flags & JS_PROP_WRITABLE))) {
                JS_FreeValue(ctx, val);
                return JS_ThrowTypeErrorReadOnly(ctx, JS_PROP_THROW, prop);
            }
        }
        set_value(ctx, &pr->u.value, val);
        return 0;
    }
    flags = JS_PROP_THROW_STRICT;
    if (is_strict_mode(ctx)) 
        flags |= JS_PROP_NO_ADD;
    return JS_SetPropertyInternal(ctx, ctx->global_obj, prop, val, flags);
}